

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_NtkResetNode(Acb_Ntk_t *p,int Pivot,word uTruth,Vec_Int_t *vSupp)

{
  Vec_Wrd_t *p_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  p_01 = Vec_IntAlloc(6);
  iVar2 = Acb_ObjIsCio(p,Pivot);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, Pivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                  ,0x28a,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
  }
  piVar5 = Acb_ObjFanins(p,Pivot);
  for (lVar11 = 0; lVar11 < *piVar5; lVar11 = lVar11 + 1) {
    Vec_IntPush(p_01,piVar5[lVar11 + 1]);
  }
  p_00 = &p->vObjTruth;
  iVar2 = (p->vObjTruth).nSize;
  if (iVar2 <= Pivot) {
    iVar12 = Pivot + 1;
    iVar3 = p_00->nCap * 2;
    iVar4 = iVar12;
    if ((iVar3 <= Pivot) || (iVar4 = iVar3, p_00->nCap <= Pivot)) {
      Vec_WrdGrow(p_00,iVar4);
      iVar2 = (p->vObjTruth).nSize;
    }
    for (lVar11 = (long)iVar2; lVar11 < iVar12; lVar11 = lVar11 + 1) {
      (p->vObjTruth).pArray[lVar11] = 0;
    }
    (p->vObjTruth).nSize = iVar12;
  }
  Vec_WrdWriteEntry(p_00,Pivot,uTruth);
  pVVar6 = Vec_WecEntry(&p->vCnfs,Pivot);
  Vec_IntErase(pVVar6);
  piVar5 = Acb_ObjFanins(p,Pivot);
  lVar11 = 0;
  while (lVar11 < *piVar5) {
    lVar8 = lVar11 + 1;
    lVar11 = lVar11 + 1;
    pVVar6 = Vec_WecEntry(&p->vFanouts,piVar5[lVar8]);
    uVar7 = pVVar6->nSize;
    uVar9 = 0;
    if (0 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    lVar8 = 1;
    uVar10 = 0;
    while( true ) {
      if (uVar9 == uVar10) {
        if (-1 < (int)uVar7) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
        }
        __assert_fail("i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
      }
      piVar1 = pVVar6->pArray;
      if (piVar1[uVar10] == Pivot) break;
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 1;
    }
    for (; (int)lVar8 < (int)uVar7; lVar8 = lVar8 + 1) {
      piVar1[lVar8 + -1] = piVar1[lVar8];
      uVar7 = pVVar6->nSize;
    }
    pVVar6->nSize = uVar7 - 1;
  }
  piVar5 = Acb_ObjFanins(p,Pivot);
  iVar2 = *piVar5;
  for (lVar11 = 1; lVar11 <= iVar2; lVar11 = lVar11 + 1) {
    if (piVar5[lVar11] < 1) {
      __assert_fail("pFanins[i] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                    ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
    }
    piVar5[lVar11] = -1;
  }
  *piVar5 = 0;
  iVar2 = Acb_ObjFanoutNum(p,Pivot);
  if (vSupp == (Vec_Int_t *)0x0) {
    if (iVar2 == 0) {
      if (Pivot < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xef,"void Acb_ObjCleanType(Acb_Ntk_t *, int)");
      }
      if ((p->vObjType).nSize <= Pivot) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      (p->vObjType).pArray[(uint)Pivot] = '\0';
    }
  }
  else {
    if (iVar2 < 1) {
      __assert_fail("Acb_ObjFanoutNum(p, Pivot) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                    ,0x296,"void Acb_NtkResetNode(Acb_Ntk_t *, int, word, Vec_Int_t *)");
    }
    Acb_ObjAddFanins(p,Pivot,vSupp);
    Acb_ObjAddFaninFanout(p,Pivot);
  }
  iVar12 = 0;
  iVar2 = p_01->nSize;
  if (p_01->nSize < 1) {
    iVar2 = iVar12;
  }
  for (; iVar2 != iVar12; iVar12 = iVar12 + 1) {
    iVar3 = Vec_IntEntry(p_01,iVar12);
    iVar4 = Acb_ObjIsCio(p,iVar3);
    if (iVar4 == 0) {
      iVar4 = Acb_ObjFanoutNum(p,iVar3);
      if (iVar4 == 0) {
        Acb_NtkResetNode(p,iVar3,0,(Vec_Int_t *)0x0);
      }
    }
  }
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Acb_NtkResetNode( Acb_Ntk_t * p, int Pivot, word uTruth, Vec_Int_t * vSupp )
{
    // remember old fanins
    int k, iFanin, * pFanins; 
    Vec_Int_t * vFanins = Vec_IntAlloc( 6 );
    assert( !Acb_ObjIsCio(p, Pivot) );
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        Vec_IntPush( vFanins, iFanin );
    // update function
    Vec_WrdSetEntry( &p->vObjTruth, Pivot, uTruth );
    Vec_IntErase( Vec_WecEntry(&p->vCnfs, Pivot) );
    // remove old fanins
    Acb_ObjRemoveFaninFanout( p, Pivot );
    Acb_ObjRemoveFanins( p, Pivot );
    // add new fanins
    if ( vSupp != NULL )
    {
        assert( Acb_ObjFanoutNum(p, Pivot) > 0 );
        Acb_ObjAddFanins( p, Pivot, vSupp );
        Acb_ObjAddFaninFanout( p, Pivot );
    }
    else if ( Acb_ObjFanoutNum(p, Pivot) == 0 )
        Acb_ObjCleanType( p, Pivot );
    // delete dangling fanins
    Vec_IntForEachEntry( vFanins, iFanin, k )
        if ( !Acb_ObjIsCio(p, iFanin) && Acb_ObjFanoutNum(p, iFanin) == 0 )
            Acb_NtkResetNode( p, iFanin, 0, NULL );
    Vec_IntFree( vFanins );
}